

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap_str.c
# Opt level: O1

char * ap_str_trim_head_from_set(char *str,char *set)

{
  ulong uVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  bool bVar8;
  
  if (set != (char *)0x0 && str != (char *)0x0) {
    sVar3 = strlen(str);
    sVar4 = strlen(set);
    if (sVar4 != 0 && sVar3 != 0) {
      sVar5 = 0;
      pcVar7 = str;
      do {
        bVar8 = true;
        if (str[sVar5] != *set) {
          uVar6 = 0;
          do {
            if (sVar4 - 1 == uVar6) {
              bVar8 = false;
              goto LAB_00103700;
            }
            uVar1 = uVar6 + 1;
            lVar2 = uVar6 + 1;
            uVar6 = uVar1;
          } while (str[sVar5] != set[lVar2]);
          bVar8 = uVar1 < sVar4;
        }
        pcVar7 = pcVar7 + 1;
LAB_00103700:
      } while ((bVar8) && (sVar5 = sVar5 + 1, sVar5 != sVar3));
      if (str < pcVar7) {
        sVar3 = strlen(pcVar7);
        pcVar7 = (char *)memmove(str,pcVar7,sVar3 + 1);
        return pcVar7;
      }
    }
  }
  return str;
}

Assistant:

char * ap_str_trim_head_from_set (char *str, const char *set)
{
	size_t			str_len;
	size_t			set_len;
	size_t			i;
	size_t			j;
	char			*p				= NULL;
	unsigned int	found			= 0;

	if (str == NULL || set == NULL)
	{
		goto finish;
	}

	str_len = strlen (str);
	set_len = strlen (set);

	if (str_len == 0 || set_len == 0)
	{
		goto finish;
	}

	p = str;

	for (i = 0; i < str_len; i ++)
	{
		found = 0;

		for (j = 0; j < set_len; j ++)
		{
			if (str[i] == set[j])
			{
				found = 1;
				p ++;

				break;
			}
		}

		if (found == 0)
		{
			break;
		}
	}

	if (p > str)
	{
		str_len = strlen (p);
		memmove (str, p, str_len + 1);
	}

finish:
	return str;
}